

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O1

int doctest::detail::wildcmp(char *str,char *wild,bool caseSensitive)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  
  cVar6 = *str;
  for (; (cVar6 != '\0' && (cVar1 = *wild, cVar1 != '*')); wild = wild + 1) {
    if (caseSensitive) {
      if (cVar1 != '?' && cVar1 != cVar6) {
        return 0;
      }
    }
    else {
      cVar5 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar5 = cVar1;
      }
      cVar7 = cVar6 + ' ';
      if (0x19 < (byte)(cVar6 + 0xbfU)) {
        cVar7 = cVar6;
      }
      if ((cVar1 != '?') && (cVar5 != cVar7)) {
        return 0;
      }
    }
    cVar6 = str[1];
    str = str + 1;
  }
  cVar6 = *str;
  if (cVar6 != '\0') {
    pcVar4 = (char *)0x0;
    pcVar2 = (char *)0x0;
    do {
      cVar1 = *wild;
      if (cVar1 == '*') {
        if (wild[1] == '\0') {
          return 1;
        }
        pcVar4 = wild + 1;
        pcVar3 = str + 1;
        wild = pcVar4;
      }
      else {
        if (caseSensitive) {
          if (cVar1 != '?' && cVar1 != cVar6) {
LAB_00105a53:
            pcVar3 = pcVar2 + 1;
            wild = pcVar4;
            str = pcVar2;
            goto LAB_00105a64;
          }
        }
        else {
          cVar5 = cVar1 + ' ';
          if (0x19 < (byte)(cVar1 + 0xbfU)) {
            cVar5 = cVar1;
          }
          cVar7 = cVar6 + ' ';
          if (0x19 < (byte)(cVar6 + 0xbfU)) {
            cVar7 = cVar6;
          }
          if ((cVar1 != '?') && (cVar5 != cVar7)) goto LAB_00105a53;
        }
        pcVar3 = pcVar2;
        wild = wild + 1;
        str = str + 1;
      }
LAB_00105a64:
      cVar6 = *str;
      pcVar2 = pcVar3;
    } while (cVar6 != '\0');
  }
  do {
    cVar6 = *wild;
    wild = wild + 1;
  } while (cVar6 == '*');
  return (uint)(cVar6 == '\0');
}

Assistant:

int wildcmp(const char* str, const char* wild, bool caseSensitive) {
        const char* cp = 0;
        const char* mp = 0;

        // rolled my own tolower() to not include more headers
        while((*str) && (*wild != '*')) {
            if((caseSensitive ? (*wild != *str) : (tolower(*wild) != tolower(*str))) &&
               (*wild != '?')) {
                return 0;
            }
            wild++;
            str++;
        }

        while(*str) {
            if(*wild == '*') {
                if(!*++wild) {
                    return 1;
                }
                mp = wild;
                cp = str + 1;
            } else if((caseSensitive ? (*wild == *str) : (tolower(*wild) == tolower(*str))) ||
                      (*wild == '?')) {
                wild++;
                str++;
            } else {
                wild = mp;
                str  = cp++;
            }
        }

        while(*wild == '*') {
            wild++;
        }
        return !*wild;
    }